

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.h
# Opt level: O0

int CImageInfo::GetPixelSize(int Format)

{
  int Format_local;
  undefined4 local_4;
  
  if (Format == 0) {
    local_4 = 3;
  }
  else if (Format == 1) {
    local_4 = 4;
  }
  else if (Format == 2) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int GetPixelSize(int Format)
	{
		switch(Format)
		{
		case FORMAT_RGB: return 3;
		case FORMAT_RGBA: return 4;
		case FORMAT_ALPHA: return 1;
		}
		return 0;
	}